

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

Mat3x3d * __thiscall OpenMD::Thermo::getPressureTensor(Mat3x3d *__return_storage_ptr__,Thermo *this)

{
  double s;
  Snapshot *this_00;
  Molecule *pMVar1;
  StuntDouble *this_01;
  pointer ppSVar2;
  RealType s_00;
  MoleculeIterator i;
  Mat3x3d virialTensor;
  Vector3d vcom;
  Mat3x3d pressureTensor;
  Mat3x3d p_tens;
  MoleculeIterator local_248;
  RectMatrix<double,_3U,_3U> local_240;
  Vector<double,_3U> local_1f8;
  SquareMatrix<double,_3> local_1e0;
  RectMatrix<double,_3U,_3U> local_198;
  RectMatrix<double,_3U,_3U> local_150;
  RectMatrix<double,_3U,_3U> local_108;
  RectMatrix<double,_3U,_3U> local_c0;
  RectMatrix<double,_3U,_3U> local_78;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasPressureTensor == false) {
    SquareMatrix<double,_3>::SquareMatrix(&local_1e0);
    RectMatrix<double,_3U,_3U>::RectMatrix(&local_78,0.0);
    Vector<double,_3U>::Vector(&local_1f8);
    local_248._M_node = (_Base_ptr)0x0;
    pMVar1 = SimInfo::beginMolecule(this->info_,&local_248);
    while (pMVar1 != (Molecule *)0x0) {
      ppSVar2 = (pMVar1->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar2 !=
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_00148d18;
      this_01 = (StuntDouble *)0x0;
      while (this_01 != (StuntDouble *)0x0) {
        s = this_01->mass_;
        StuntDouble::getVel((Vector3d *)&local_240,this_01);
        Vector<double,_3U>::operator=(&local_1f8,(Vector<double,_3U> *)&local_240);
        outProduct<double>((SquareMatrix3<double> *)&local_c0,(Vector3<double> *)&local_1f8,
                           (Vector3<double> *)&local_1f8);
        operator*(&local_240,s,&local_c0);
        RectMatrix<double,_3U,_3U>::add(&local_78,&local_240);
        ppSVar2 = ppSVar2 + 1;
        this_01 = (StuntDouble *)0x0;
        if (ppSVar2 !=
            (pMVar1->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
LAB_00148d18:
          this_01 = *ppSVar2;
        }
      }
      pMVar1 = SimInfo::nextMolecule(this->info_,&local_248);
    }
    s_00 = getVolume(this);
    Snapshot::getVirialTensor((Mat3x3d *)&local_240,this_00);
    operator*(&local_198,0.0004184,&local_240);
    operator+(&local_150,&local_78,&local_198);
    operator/(&local_108,&local_150,s_00);
    RectMatrix<double,_3U,_3U>::operator=(&local_c0,&local_108);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)&local_1e0,(SquareMatrix<double,_3> *)&local_c0);
    Snapshot::setPressureTensor(this_00,(Mat3x3d *)&local_1e0);
  }
  Snapshot::getPressureTensor(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

Mat3x3d Thermo::getPressureTensor() {
    // returns pressure tensor in units amu*fs^-2*Ang^-1
    // routine derived via viral theorem description in:
    // Paci, E. and Marchi, M. J.Phys.Chem. 1996, 100, 4314-4322
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasPressureTensor) {
      Mat3x3d pressureTensor;
      Mat3x3d p_tens(0.0);
      RealType mass;
      Vector3d vcom;

      SimInfo::MoleculeIterator i;
      vector<StuntDouble*>::iterator j;
      Molecule* mol;
      StuntDouble* sd;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          mass = sd->getMass();
          vcom = sd->getVel();
          p_tens += mass * outProduct(vcom, vcom);
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, p_tens.getArrayPointer(), 9, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      RealType volume      = this->getVolume();
      Mat3x3d virialTensor = snap->getVirialTensor();

      pressureTensor =
          (p_tens + Constants::energyConvert * virialTensor) / volume;

      snap->setPressureTensor(pressureTensor);
    }
    return snap->getPressureTensor();
  }